

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exceptions.h
# Opt level: O0

void __thiscall
kaitai::validation_failed_error::validation_failed_error
          (validation_failed_error *this,string *what,kstream *io,string *src_path)

{
  uint64_t val;
  string local_d8;
  type local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  string *local_28;
  string *src_path_local;
  kstream *io_local;
  string *what_local;
  validation_failed_error *this_local;
  
  local_28 = src_path;
  src_path_local = (string *)io;
  io_local = (kstream *)what;
  what_local = (string *)this;
  val = kstream::pos(io);
  kstream::to_string<unsigned_long>(&local_a8,val);
  std::operator+(&local_88,"at pos ",&local_a8);
  std::operator+(&local_68,&local_88,": validation failed: ");
  std::operator+(&local_48,&local_68,what);
  std::__cxx11::string::string((string *)&local_d8,(string *)src_path);
  kstruct_error::kstruct_error(&this->super_kstruct_error,&local_48,&local_d8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_a8);
  *(undefined ***)&this->super_kstruct_error = &PTR__validation_failed_error_0037aa00;
  this->m_io = (kstream *)src_path_local;
  return;
}

Assistant:

validation_failed_error(const std::string what, kstream* io, const std::string src_path):
        kstruct_error("at pos " + kstream::to_string(io->pos()) + ": validation failed: " + what, src_path),
        m_io(io)
    {
    }